

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall Importer_getNonexistentModel_Test::TestBody(Importer_getNonexistentModel_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  AssertHelper local_f0 [8];
  Message local_e8 [15];
  allocator<char> local_d9;
  string local_d8 [32];
  shared_ptr<libcellml::Model> local_b8;
  undefined1 local_a8 [16];
  AssertionResult gtest_ar;
  string local_88 [55];
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  ModelPtr model;
  ImporterPtr importer;
  Importer_getNonexistentModel_Test *this_local;
  
  libcellml::Importer::create((bool)((char)&model + '\b'));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"model",&local_51);
  libcellml::Model::create((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  peVar2 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"howdy",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::Importer::addModel((shared_ptr *)peVar2,(string *)local_30);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_a8._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"bonjour",&local_d9);
  libcellml::Importer::library((string *)&local_b8);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            (local_a8 + 8,"nullptr",(void **)"importer->library(\"bonjour\")",
             (shared_ptr<libcellml::Model> *)local_a8,&local_b8);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_a8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_a8 + 8));
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x1ac,pcVar3);
    testing::internal::AssertHelper::operator=(local_f0,local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_a8 + 8));
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Importer, getNonexistentModel)
{
    auto importer = libcellml::Importer::create();
    auto model = libcellml::Model::create("model");
    importer->addModel(model, "howdy");
    EXPECT_EQ(nullptr, importer->library("bonjour"));
}